

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

bool __thiscall
dlib::image_window::get_next_keypress
          (image_window *this,unsigned_long *key,bool *is_printable,unsigned_long *state)

{
  undefined8 *in_RCX;
  byte *in_RDX;
  undefined8 *in_RSI;
  void *__stat_loc;
  long in_RDI;
  auto_mutex lock;
  rmutex *in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  byte bVar1;
  bool local_1;
  
  __stat_loc = *(void **)(in_RDI + 0x40);
  auto_mutex::auto_mutex
            ((auto_mutex *)
             CONCAT17(in_stack_ffffffffffffffa7,
                      CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
             in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = 0;
    if ((((*(byte *)(in_RDI + 0x1e40) & 1) == 0) &&
        (bVar1 = 0, (*(byte *)(in_RDI + 0x1db0) & 1) == 0)) &&
       (bVar1 = 1, (*(byte *)(in_RDI + 0x1db1) & 1) != 0)) {
      bVar1 = *(byte *)(in_RDI + 0x1e60) ^ 0xff;
    }
    if ((bVar1 & 1) == 0) break;
    rsignaler::wait((rsignaler *)(in_RDI + 0x1dd0),__stat_loc);
  }
  if ((*(byte *)(in_RDI + 0x1db0) & 1) == 0) {
    if ((*(byte *)(in_RDI + 0x1e40) & 1) == 0) {
      *in_RSI = 0;
      *in_RDX = 1;
      local_1 = false;
    }
    else {
      *(undefined1 *)(in_RDI + 0x1e40) = 0;
      *in_RSI = *(undefined8 *)(in_RDI + 0x1e48);
      *in_RDX = *(byte *)(in_RDI + 0x1e50) & 1;
      *in_RCX = *(undefined8 *)(in_RDI + 0x1e58);
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  auto_mutex::~auto_mutex((auto_mutex *)0x44dc51);
  return local_1;
}

Assistant:

bool image_window::
    get_next_keypress (
        unsigned long& key,
        bool& is_printable,
        unsigned long& state
    ) 
    {
        auto_mutex lock(wm);
        while (have_last_keypress == false && !window_has_closed &&
            (have_last_click == false || !tie_input_events))
        {
            clicked_signaler.wait();
        }

        if (window_has_closed)
            return false;

        if (have_last_keypress)
        {
            // Mark that we are taking the key click so the next call to get_next_keypress()
            // will have to wait for another click.
            have_last_keypress = false;
            key = next_key;
            is_printable = next_is_printable;
            state = next_state;
            return true;
        }
        else
        {
            key = 0;
            is_printable = true;
            return false;
        }
    }